

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O1

Point __thiscall cppurses::Text_display::display_position(Text_display *this,size_t index)

{
  pointer pLVar1;
  pointer pLVar2;
  ulong uVar3;
  pointer pGVar4;
  pointer pGVar5;
  size_t sVar6;
  size_t sVar7;
  ulong in_RCX;
  pointer pLVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  bool bVar12;
  Point PVar13;
  
  pLVar1 = (this->display_state_).
           super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->display_state_).
           super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar12 = pLVar1 == pLVar2;
  if ((!bVar12) && (in_RCX = 0xffffffffffffffff, pLVar1->start_index <= index)) {
    uVar10 = 0;
    pLVar8 = pLVar1;
    do {
      pLVar8 = pLVar8 + 1;
      bVar12 = pLVar8 == pLVar2;
      if (bVar12) break;
      if (index < pLVar8->start_index) {
        in_RCX = uVar10;
      }
      uVar10 = uVar10 + 1;
    } while (pLVar8->start_index <= index);
  }
  uVar10 = ((long)pLVar2 - (long)pLVar1 >> 4) - 1;
  if (!bVar12) {
    uVar10 = in_RCX;
  }
  uVar3 = this->top_line_;
  if (uVar10 < uVar3) {
    sVar6 = 0;
    sVar11 = 0;
  }
  else {
    sVar6 = display_height(this);
    uVar9 = (uVar3 + sVar6) - 1;
    if (uVar9 < uVar10) {
      pLVar1 = (this->display_state_).
               super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = uVar9;
      if (sVar6 + uVar3 <
          (ulong)((long)(this->display_state_).
                        super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 4)) {
        sVar6 = pLVar1[sVar6 + uVar3].start_index;
      }
      else {
        pGVar4 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                 super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pGVar5 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                 super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pGVar4 == pGVar5) {
          sVar6 = 0;
        }
        else {
          sVar6 = ((long)pGVar5 - (long)pGVar4 >> 3) * -0x5555555555555555 - 1;
        }
      }
    }
    else {
      sVar6 = ((long)(this->contents_).
                     super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                     super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->contents_).
                     super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                     super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if (index <= sVar6) {
        sVar6 = index;
      }
    }
    sVar11 = uVar10 - this->top_line_;
    sVar7 = first_index_at(this,uVar10);
    sVar6 = sVar6 - sVar7;
  }
  PVar13.y = sVar11;
  PVar13.x = sVar6;
  return PVar13;
}

Assistant:

Point Text_display::display_position(std::size_t index) const {
    Point position;
    auto line = this->line_at(index);
    if (line < this->top_line()) {
        return position;
    }
    const auto last_shown_line = this->bottom_line();
    if (line > last_shown_line) {
        line = last_shown_line;
        index = this->last_index_at(line);
    } else if (index > this->contents().size()) {
        index = this->contents().size();
    }
    position.y = line - this->top_line();
    position.x = index - this->first_index_at(line);
    return position;
}